

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall
spvtools::opt::CFG::ForEachBlockInReversePostOrder
          (CFG *this,BasicBlock *bb,function<void_(spvtools::opt::BasicBlock_*)> *f)

{
  function<void_(spvtools::opt::BasicBlock_*)> local_60;
  function<bool_(spvtools::opt::BasicBlock_*)> local_40;
  function<void_(spvtools::opt::BasicBlock_*)> *local_20;
  function<void_(spvtools::opt::BasicBlock_*)> *f_local;
  BasicBlock *bb_local;
  CFG *this_local;
  
  local_20 = f;
  f_local = (function<void_(spvtools::opt::BasicBlock_*)> *)bb;
  bb_local = (BasicBlock *)this;
  std::function<void_(spvtools::opt::BasicBlock_*)>::function(&local_60,f);
  std::function<bool(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::CFG::ForEachBlockInReversePostOrder(spvtools::opt::BasicBlock*,std::function<void(spvtools::opt::BasicBlock*)>const&)::__0,void>
            ((function<bool(spvtools::opt::BasicBlock*)> *)&local_40,
             (anon_class_32_1_54a39806 *)&local_60);
  WhileEachBlockInReversePostOrder(this,bb,&local_40);
  std::function<bool_(spvtools::opt::BasicBlock_*)>::~function(&local_40);
  ForEachBlockInReversePostOrder(spvtools::opt::BasicBlock*,std::function<void(spvtools::opt::BasicBlock*)>const&)
  ::$_0::~__0((__0 *)&local_60);
  return;
}

Assistant:

void CFG::ForEachBlockInReversePostOrder(
    BasicBlock* bb, const std::function<void(BasicBlock*)>& f) {
  WhileEachBlockInReversePostOrder(bb, [f](BasicBlock* b) {
    f(b);
    return true;
  });
}